

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_save.c
# Opt level: O1

void do_asave(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  DESCRIPTOR_DATA *pDVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  AREA_DATA_conflict *pAVar6;
  size_t sVar7;
  AREA_DATA_conflict **ppAVar8;
  char *pcVar9;
  string_view fmt;
  char arg1 [4608];
  char buf [4608];
  char local_2438 [4608];
  char local_1238 [4616];
  
  bVar3 = check_security(ch);
  if (!bVar3) {
    return;
  }
  if (ch == (CHAR_DATA *)0x0) {
    save_area_list();
    for (pAVar6 = area_first; pAVar6 != (AREA_DATA_conflict *)0x0; pAVar6 = pAVar6->next) {
      *(byte *)pAVar6->area_flags = (byte)pAVar6->area_flags[0] & 199;
      save_area(pAVar6);
    }
    return;
  }
  iVar5 = get_security(ch);
  if (iVar5 < 10) {
    one_argument(argument,local_2438);
    if (local_2438[0] == '\0') {
      bVar3 = is_switched(ch);
      if (!bVar3) {
        iVar5 = ch->pcdata->security;
        pAVar6 = ch->in_room->area;
        iVar1 = pAVar6->security;
        if (((iVar1 < iVar5) || (pcVar9 = strstr(pAVar6->builders,ch->name), iVar1 < iVar5)) ||
           ((pcVar9 != (char *)0x0 ||
            (pcVar9 = strstr(pAVar6->builders,"All"), pcVar9 != (char *)0x0)))) {
          *(byte *)pAVar6->area_flags = (byte)pAVar6->area_flags[0] & 199;
          save_area(pAVar6);
          pcVar9 = "Saved.\n\r";
          goto LAB_0036b7ef;
        }
      }
      pcVar9 = "You are not in your area.\n\r";
    }
    else {
      bVar3 = str_cmp(local_2438,"changed");
      if (bVar3) {
        send_to_char("Syntax:\n\r",ch);
        send_to_char("  asave         - saves area you are currently in.\n\r",ch);
        pcVar9 = "  asave changed - saves all areas in your name that have been changed.\n\r";
      }
      else {
        if (area_first != (AREA_DATA_conflict *)0x0) {
          bVar3 = false;
          pAVar6 = area_first;
          do {
            bVar4 = is_switched(ch);
            if (!bVar4) {
              iVar5 = ch->pcdata->security;
              iVar1 = pAVar6->security;
              if ((((iVar1 < iVar5) || (pcVar9 = strstr(pAVar6->builders,ch->name), iVar1 < iVar5))
                  || ((pcVar9 != (char *)0x0 ||
                      (pcVar9 = strstr(pAVar6->builders,"All"), pcVar9 != (char *)0x0)))) &&
                 ((pAVar6->area_flags[0] & 0x18U) != 0)) {
                pAVar6->area_flags[0] = pAVar6->area_flags[0] & 0xffffffffffffffc7;
                save_area(pAVar6);
                sprintf(local_1238,"%24s - \'%s\'\n\r",pAVar6->name,pAVar6->file_name);
                send_to_char(local_1238,ch);
                bVar3 = true;
              }
            }
            pAVar6 = pAVar6->next;
          } while (pAVar6 != (AREA_DATA_conflict *)0x0);
          if (bVar3) {
            return;
          }
        }
        pcVar9 = "No areas were saved.\n\r";
      }
    }
  }
  else {
    smash_tilde(argument);
    strcpy(local_2438,argument);
    if (local_2438[0] == '\0') {
      send_to_char("Syntax:\n\r",ch);
      send_to_char("  asave <vnum>   - saves a particular area\n\r",ch);
      send_to_char("  asave list     - saves the area.lst file\n\r",ch);
      send_to_char("  asave area     - saves the area being edited\n\r",ch);
      send_to_char("  asave changed  - saves all changed zones\n\r",ch);
      send_to_char("  asave world    - saves the world! (db dump)\n\r",ch);
      pcVar9 = "\n\r";
    }
    else {
      iVar5 = atoi(local_2438);
      pAVar6 = get_area_data(iVar5);
      if ((pAVar6 == (AREA_DATA_conflict *)0x0) && (bVar3 = is_number(local_2438), bVar3)) {
        pcVar9 = "That area does not exist.\n\r";
      }
      else {
        bVar3 = is_number(local_2438);
        if (bVar3) {
          bVar3 = is_switched(ch);
          if (!bVar3) {
            iVar5 = ch->pcdata->security;
            iVar1 = pAVar6->security;
            if ((((iVar1 < iVar5) || (pcVar9 = strstr(pAVar6->builders,ch->name), iVar1 < iVar5)) ||
                (pcVar9 != (char *)0x0)) ||
               (pcVar9 = strstr(pAVar6->builders,"All"), pcVar9 != (char *)0x0)) {
              save_area_list();
              *(byte *)pAVar6->area_flags = (byte)pAVar6->area_flags[0] & 199;
              save_area(pAVar6);
              return;
            }
          }
        }
        else {
          bVar3 = str_cmp("world",local_2438);
          if (!bVar3) {
            save_area_list();
            if (area_first != (AREA_DATA_conflict *)0x0) {
              pAVar6 = area_first;
              do {
                bVar3 = is_switched(ch);
                if (!bVar3) {
                  iVar5 = ch->pcdata->security;
                  iVar1 = pAVar6->security;
                  if ((((iVar1 < iVar5) ||
                       (pcVar9 = strstr(pAVar6->builders,ch->name), iVar1 < iVar5)) ||
                      ((pcVar9 != (char *)0x0 ||
                       (pcVar9 = strstr(pAVar6->builders,"All"), pcVar9 != (char *)0x0)))) &&
                     ((pAVar6->area_flags[0] & 0x18U) != 0)) {
                    pAVar6->area_flags[0] = pAVar6->area_flags[0] & 0xffffffffffffffc7;
                    pcVar9 = pAVar6->name;
                    sVar7 = strlen(pcVar9);
                    fmt._M_str = pcVar9;
                    fmt._M_len = sVar7;
                    CLogger::Info<>((CLogger *)&RS.field_0x140,fmt);
                    sprintf(local_1238,"Saving..%s\n",pAVar6->name);
                    wiznet(local_1238,(CHAR_DATA *)0x0,(OBJ_DATA *)0x0,0x18,0,0);
                    save_area(pAVar6);
                  }
                }
                pAVar6 = pAVar6->next;
              } while (pAVar6 != (AREA_DATA_conflict *)0x0);
            }
            pcVar9 = "You saved the world.\n\r";
            goto LAB_0036b7ef;
          }
          bVar3 = str_cmp("changed",local_2438);
          if (!bVar3) {
            save_area_list();
            send_to_char("Saved zones:\n\r",ch);
            builtin_strncpy(local_1238,"None.\n\r",8);
            if (area_first != (AREA_DATA_conflict *)0x0) {
              pAVar6 = area_first;
              do {
                bVar3 = is_switched(ch);
                if (!bVar3) {
                  iVar5 = ch->pcdata->security;
                  iVar1 = pAVar6->security;
                  if ((((iVar1 < iVar5) ||
                       (pcVar9 = strstr(pAVar6->builders,ch->name), iVar1 < iVar5)) ||
                      ((pcVar9 != (char *)0x0 ||
                       (pcVar9 = strstr(pAVar6->builders,"All"), pcVar9 != (char *)0x0)))) &&
                     ((pAVar6->area_flags[0] & 0x18U) != 0)) {
                    pAVar6->area_flags[0] = pAVar6->area_flags[0] & 0xffffffffffffffc7;
                    save_area(pAVar6);
                    sprintf(local_1238,"%24s - \'%s\'\n\r",pAVar6->name,pAVar6->file_name);
                    send_to_char(local_1238,ch);
                  }
                }
                pAVar6 = pAVar6->next;
              } while (pAVar6 != (AREA_DATA_conflict *)0x0);
            }
            bVar3 = str_cmp(local_1238,"None.\n\r");
            if (bVar3) {
              return;
            }
            pcVar9 = local_1238;
            goto LAB_0036b7ef;
          }
          bVar3 = str_cmp(local_2438,"list");
          if (!bVar3) {
            save_area_list();
            return;
          }
          bVar3 = str_cmp(local_2438,"area");
          if (bVar3) {
            do_asave(ch,"");
            return;
          }
          pDVar2 = ch->desc;
          switch(pDVar2->editor) {
          case 0:
            pcVar9 = "You are not editing an area therefore an area vnum is required.\n\r";
            goto LAB_0036b7ef;
          case 1:
            ppAVar8 = (AREA_DATA_conflict **)&pDVar2->pEdit;
            break;
          default:
            ppAVar8 = &ch->in_room->area;
            break;
          case 3:
          case 4:
            ppAVar8 = (AREA_DATA_conflict **)((long)pDVar2->pEdit + 0x28);
          }
          pAVar6 = *ppAVar8;
          bVar3 = is_switched(ch);
          if (!bVar3) {
            iVar5 = ch->pcdata->security;
            iVar1 = pAVar6->security;
            if ((((iVar1 < iVar5) || (pcVar9 = strstr(pAVar6->builders,ch->name), iVar1 < iVar5)) ||
                (pcVar9 != (char *)0x0)) ||
               (pcVar9 = strstr(pAVar6->builders,"All"), pcVar9 != (char *)0x0)) {
              save_area_list();
              *(byte *)pAVar6->area_flags = (byte)pAVar6->area_flags[0] & 199;
              save_area(pAVar6);
              pcVar9 = "Area saved.\n\r";
              goto LAB_0036b7ef;
            }
          }
        }
        pcVar9 = "You are not a builder for this area.\n\r";
      }
    }
  }
LAB_0036b7ef:
  send_to_char(pcVar9,ch);
  return;
}

Assistant:

void do_asave(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH], buf[MSL];
	AREA_DATA *pArea;
	FILE *fp;
	int value;
	bool found = false;

	fp = nullptr;

	if (!check_security(ch))
		return;

	if (!ch) /* Do an autosave */
	{
		save_area_list();

		for (pArea = area_first; pArea; pArea = pArea->next)
		{
			clean_olc_aflags(pArea);
			save_area(pArea);
		}

		return;
	}

	if (get_security(ch) < 10)
	{
		argument = one_argument(argument, arg1);

		if (arg1[0] == '\0')
		{
			if (IS_BUILDER(ch, ch->in_room->area))
			{
				clean_olc_aflags(ch->in_room->area);
				save_area(ch->in_room->area);
				send_to_char("Saved.\n\r", ch);
				return;
			}
			else
			{
				send_to_char("You are not in your area.\n\r", ch);
				return;
			}
		}
		else if (!str_cmp(arg1, "changed"))
		{
			for (pArea = area_first; pArea; pArea = pArea->next)
			{
				if (!IS_BUILDER(ch, pArea))
					continue;

				if (IS_SET(pArea->area_flags, AREA_CHANGED) || IS_SET(pArea->area_flags, AREA_ADDED))
				{
					found = true;
					clean_olc_aflags(pArea);
					save_area(pArea);
					sprintf(buf, "%24s - '%s'\n\r", pArea->name, pArea->file_name);
					send_to_char(buf, ch);
				}
			}

			if (!found)
				send_to_char("No areas were saved.\n\r", ch);
		}
		else
		{
			send_to_char("Syntax:\n\r", ch);
			send_to_char("  asave         - saves area you are currently in.\n\r", ch);
			send_to_char("  asave changed - saves all areas in your name that have been changed.\n\r", ch);
			return;
		}
	}
	else
	{
		smash_tilde(argument);
		strcpy(arg1, argument);

		if (arg1[0] == '\0')
		{
			send_to_char("Syntax:\n\r", ch);
			send_to_char("  asave <vnum>   - saves a particular area\n\r", ch);
			send_to_char("  asave list     - saves the area.lst file\n\r", ch);
			send_to_char("  asave area     - saves the area being edited\n\r", ch);
			send_to_char("  asave changed  - saves all changed zones\n\r", ch);
			send_to_char("  asave world    - saves the world! (db dump)\n\r", ch);
			send_to_char("\n\r", ch);
			return;
		}

		/* Snarf the value (which need not be numeric). */
		value = atoi(arg1);

		if (!(pArea = get_area_data(value)) && is_number(arg1))
		{
			send_to_char("That area does not exist.\n\r", ch);
			return;
		}

		/* Save area of given vnum. */
		/* ------------------------ */
		if (is_number(arg1))
		{
			if (!IS_BUILDER(ch, pArea))
			{
				send_to_char("You are not a builder for this area.\n\r", ch);
				return;
			}

			save_area_list();
			clean_olc_aflags(pArea);
			save_area(pArea);
			return;
		}

		/* Save the world, only authorized areas. */
		/* -------------------------------------- */
		if (!str_cmp("world", arg1))
		{
			save_area_list();

			for (pArea = area_first; pArea != nullptr; pArea = pArea->next)
			{
				char buf[MSL];

				if (!IS_BUILDER(ch, pArea))
					continue;

				if (!IS_SET(pArea->area_flags, AREA_CHANGED) && !IS_SET(pArea->area_flags, AREA_ADDED))
					continue;

				clean_olc_aflags(pArea);
				RS.Logger.Info(pArea->name);

				sprintf(buf, "Saving..%s\n", pArea->name);
				wiznet(buf, 0, nullptr, WIZ_DEBUG, 0, 0);

				save_area(pArea);
			}

			send_to_char("You saved the world.\n\r", ch);
			return;
		}

		/* Save changed areas, only authorized areas. */
		/* ------------------------------------------ */
		if (!str_cmp("changed", arg1))
		{
			char buf[MAX_INPUT_LENGTH];

			save_area_list();

			send_to_char("Saved zones:\n\r", ch);
			sprintf(buf, "None.\n\r");

			for (pArea = area_first; pArea; pArea = pArea->next)
			{
				/* Builder must be assigned this area. */
				if (!IS_BUILDER(ch, pArea))
					continue;

				/* Save changed areas. */
				if (IS_SET(pArea->area_flags, AREA_CHANGED) || IS_SET(pArea->area_flags, AREA_ADDED))
				{
					clean_olc_aflags(pArea);
					save_area(pArea);
					sprintf(buf, "%24s - '%s'\n\r", pArea->name, pArea->file_name);
					send_to_char(buf, ch);
				}
			}

			if (!str_cmp(buf, "None.\n\r"))
				send_to_char(buf, ch);

			return;
		}

		/* Save the area.lst file. */
		/* ----------------------- */
		if (!str_cmp(arg1, "list"))
		{
			save_area_list();
			return;
		}

		/* Save area being edited, if authorized. */
		/* -------------------------------------- */
		if (!str_cmp(arg1, "area"))
		{
			/* Is character currently editing. */
			if (ch->desc->editor == 0)
			{
				send_to_char("You are not editing an area therefore an area vnum is required.\n\r", ch);
				return;
			}

			/* Find the area to save. */
			switch (ch->desc->editor)
			{
				case ED_AREA:
					pArea = (AREA_DATA *)ch->desc->pEdit;
					break;
				case ED_ROOM:
					pArea = ch->in_room->area;
					break;
				case ED_OBJECT:
					pArea = ((OBJ_INDEX_DATA *)ch->desc->pEdit)->area;
					break;
				case ED_MOBILE:
					pArea = ((MOB_INDEX_DATA *)ch->desc->pEdit)->area;
					break;
				default:
					pArea = ch->in_room->area;
					break;
			}

			if (!IS_BUILDER(ch, pArea))
			{
				send_to_char("You are not a builder for this area.\n\r", ch);
				return;
			}

			save_area_list();
			clean_olc_aflags(pArea);
			save_area(pArea);
			send_to_char("Area saved.\n\r", ch);
			return;
		}

		/* Show correct syntax. */
		/* -------------------- */
		do_asave(ch, "");
	}
}